

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

uint16_t inl_qrdmlah_s16(CPUARMState_conflict *env,int16_t src1,int16_t src2,int16_t src3)

{
  int iVar1;
  uint uVar2;
  undefined6 in_register_0000000a;
  undefined2 in_register_00000012;
  undefined6 in_register_00000032;
  
  iVar1 = (int)CONCAT62(in_register_00000032,src1) * CONCAT22(in_register_00000012,src2) +
          (int)CONCAT62(in_register_0000000a,src3) * 0x8000 + 0x4000;
  uVar2 = iVar1 >> 0xf;
  if ((int)(short)uVar2 != uVar2) {
    (env->vfp).qc[0] = 1;
    uVar2 = iVar1 >> 0x1f ^ 0x7fff;
  }
  return (uint16_t)uVar2;
}

Assistant:

static uint16_t inl_qrdmlah_s16(CPUARMState *env, int16_t src1,
                                int16_t src2, int16_t src3)
{
    /* Simplify:
     * = ((a3 << 16) + ((e1 * e2) << 1) + (1 << 15)) >> 16
     * = ((a3 << 15) + (e1 * e2) + (1 << 14)) >> 15
     */
    int32_t ret = (int32_t)src1 * src2;
    ret = ((int32_t)src3 << 15) + ret + (1 << 14);
    ret >>= 15;
    if (ret != (int16_t)ret) {
        SET_QC();
        ret = (ret < 0 ? -0x8000 : 0x7fff);
    }
    return ret;
}